

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

double * __thiscall Graph::getLossesReseting(Graph *this)

{
  double *pdVar1;
  Vertex *pVVar2;
  Edge *pEVar3;
  double dVar4;
  double dVar5;
  
  pdVar1 = (double *)operator_new__(0x10);
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  for (pVVar2 = this->verticesList; pVVar2 != (Vertex *)0x0; pVVar2 = pVVar2->nextVertex) {
    pVVar2->idTree = pVVar2->id;
    pEVar3 = pVVar2->edgesList;
    if (pEVar3 != (Edge *)0x0) {
      dVar5 = *pdVar1;
      dVar4 = pdVar1[1];
      do {
        dVar5 = dVar5 + pEVar3->activeLoss;
        dVar4 = dVar4 + pEVar3->reactiveLoss;
        pEVar3->closed = (bool)(pEVar3->modifiable ^ 1);
        pEVar3->activePowerFlow = 0.0;
        pEVar3->reactivePowerFlow = 0.0;
        pEVar3->activeLoss = 0.0;
        pEVar3->reactiveLoss = 0.0;
        pEVar3 = pEVar3->nextEdge;
      } while (pEVar3 != (Edge *)0x0);
      *pdVar1 = dVar5;
      pdVar1[1] = dVar4;
    }
  }
  return pdVar1;
}

Assistant:

double *Graph::getLossesReseting(){
    double *perda = new double[2]; perda[0] = perda[1] = 0.0;
    for(Vertex *no=verticesList; no != NULL; no = no->getNext()){
        no->setIdTree(no->getID());
        for(Edge *a = no->getEdgesList(); a != NULL; a = a->getNext()){
            perda[0] += a->getActiveLoss();
            perda[1] += a->getReactiveLoss();

            //arcos nao modificaveis ficam sempre fechados
            if(a->getModifiable() == false)
                a->setSwitch(true);
            else
                a->setSwitch(false);

            a->setActiveFlow(0.0);
            a->setReactiveFlow(0.0);
            a->setActiveLoss(0.0);
            a->setReactiveLoss(0.0);
        }
    }
    return perda;
}